

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void log_error(char *message,...)

{
  FILE *file;
  char in_AL;
  char *message_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  CharBuff *local_30;
  CharBuff *buff;
  va_list list;
  char *message_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  list[0].overflow_arg_area = local_e8;
  list[0]._0_8_ = &stack0x00000008;
  buff._4_4_ = 0x30;
  buff._0_4_ = 8;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  list[0].reg_save_area = message;
  local_30 = new_buff(0x400);
  append_str(local_30,"\x1b[31mERROR\x1b[0m: ");
  append_str(local_30,(char *)list[0].reg_save_area);
  file = _stderr;
  message_00 = to_string(local_30);
  log_log(7,file,message_00,(__va_list_tag *)&buff);
  recycle_buff(local_30);
  exit(1);
}

Assistant:

void log_error(const char* message, ...){
    va_list list;
    va_start(list,message);
    CharBuff* buff = new_buff(1024);
    append_str(buff, TAG_ERROR);
    append_str(buff, message);
    log_log(LOG_LEVEL_ERROR, stderr,to_string(buff), list);
    va_end(list);
    recycle_buff(buff);
    exit(1);
}